

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::Own<const_kj::ReadableFile>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryOpenFile(InMemoryDirectory *this,PathPtr path)

{
  Mutex *this_00;
  uint uVar1;
  long lVar2;
  Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> MVar3;
  long in_RCX;
  Exception *pEVar4;
  undefined8 *puVar5;
  ReadableDirectory *extraout_RDX;
  char *pcVar6;
  ReadableDirectory *pRVar7;
  ReadableDirectory *extraout_RDX_00;
  ReadableDirectory *extraout_RDX_01;
  ReadableDirectory *extraout_RDX_02;
  String *ptrCopy;
  Maybe<kj::Own<const_kj::ReadableDirectory>_> MVar8;
  Maybe<kj::Own<const_kj::ReadableFile>_> MVar9;
  StringPtr name;
  StringPtr name_00;
  PathPtr path_00;
  Fault f;
  undefined1 local_40 [24];
  
  puVar5 = (undefined8 *)path.parts.size_;
  name_00.content.ptr = path.parts.ptr;
  if (in_RCX == 1) {
    this_00 = (Mutex *)(name_00.content.ptr + 1);
    _::Mutex::lock(this_00,SHARED);
    lVar2 = puVar5[1];
    if (lVar2 == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*puVar5;
    }
    name.content.size_ = lVar2 + (ulong)(lVar2 == 0);
    name.content.ptr = pcVar6;
    MVar3 = Impl::tryGetEntry((Impl *)(name_00.content.ptr + 2),name);
    if (MVar3.ptr == (EntryImpl *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      uVar1 = ((MVar3.ptr)->node).tag;
      if (uVar1 == 3) {
        SymlinkNode::parse((Path *)local_40,(SymlinkNode *)&((MVar3.ptr)->node).field_1);
        _::Mutex::unlock(this_00,SHARED);
        path_00.parts.size_ = local_40._0_8_;
        path_00.parts.ptr = name_00.content.ptr;
        MVar9 = tryOpenFile(this,path_00);
        pRVar7 = (ReadableDirectory *)MVar9.ptr.ptr;
        if ((Exception *)local_40._0_8_ != (Exception *)0x0) {
          (***(_func_int ***)local_40._16_8_)
                    (local_40._16_8_,local_40._0_8_,0x18,local_40._8_8_,local_40._8_8_,
                     ArrayDisposer::Dispose_<kj::String,_false>::destruct);
          pRVar7 = extraout_RDX_01;
        }
        goto LAB_00345327;
      }
      if (uVar1 == 1) {
        (**(code **)(**(long **)((long)&((MVar3.ptr)->node).field_1 + 8) + 0x28))(local_40);
        pEVar4 = (Exception *)local_40._8_8_;
        if ((Exception *)local_40._8_8_ != (Exception *)0x0) {
          pEVar4 = (Exception *)local_40._0_8_;
        }
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)pEVar4;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_40._8_8_;
      }
      else {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                  ((Fault *)local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x63f,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        _::Debug::Fault::~Fault((Fault *)local_40);
      }
    }
    _::Mutex::unlock(this_00,SHARED);
    pRVar7 = extraout_RDX_02;
  }
  else if (in_RCX == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
              ((Fault *)local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x42f,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    _::Debug::Fault::~Fault((Fault *)local_40);
    pRVar7 = extraout_RDX;
  }
  else {
    if (puVar5[1] == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*puVar5;
    }
    name_00.content.size_ = (size_t)pcVar6;
    MVar8 = tryGetParent((InMemoryDirectory *)local_40,name_00);
    pRVar7 = MVar8.ptr.ptr;
    if ((Exception *)local_40._8_8_ == (Exception *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)(*(_func_int **)local_40._8_8_ + 0x50))
                (this,local_40._8_8_,puVar5 + 3,in_RCX + -1);
      (**(code **)(((String *)local_40._0_8_)->content).ptr)
                (local_40._0_8_,local_40._8_8_ + *(long *)(*(_func_int **)local_40._8_8_ + -0x10));
      pRVar7 = extraout_RDX_00;
    }
  }
LAB_00345327:
  MVar9.ptr.ptr = (ReadableFile *)pRVar7;
  MVar9.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableFile>_>)MVar9.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("not a file") { return nullptr; }
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_MAYBE(entry, lock->tryGetEntry(path[0])) {
        return asFile(lock, *entry);
      } else {
        return nullptr;
      }
    } else {
      KJ_IF_MAYBE(subdir, tryGetParent(path[0])) {
        return subdir->get()->tryOpenFile(path.slice(1, path.size()));
      } else {
        return nullptr;
      }
    }
  }